

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::visualize_accel(PathTracer *this)

{
  double dVar1;
  double dVar2;
  Color c;
  Color c_00;
  Color c_01;
  Color c_02;
  ulong uVar3;
  bool bVar4;
  const_reference ppBVar5;
  reference ppPVar6;
  reference ppBVar7;
  size_type sVar8;
  const_reference pvVar9;
  double *pdVar10;
  long in_RDI;
  Vector3D end;
  double ray_t;
  size_t i_4;
  BVHNode *current;
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  tstack;
  size_t i_3;
  size_t i_2;
  BVHNode *child_1;
  size_t i_1;
  BVHNode *child;
  size_t i;
  BVHNode *selected;
  Color cprim_hl_edges;
  Color cprim_hl_right;
  Color cprim_hl_left;
  Color cnode_hl_child;
  Color cnode_hl;
  Color cnode;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  BBox *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  float in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde0;
  int local_1b0 [12];
  Vector3D local_180;
  double local_168;
  ulong local_160;
  Color local_158;
  Color local_148;
  Color local_138;
  Color local_128;
  value_type local_110;
  BVHNode *local_f8;
  ulong local_a0;
  ulong local_98;
  BVHNode *local_90;
  ulong local_88;
  BVHNode *local_80;
  ulong local_78;
  value_type local_70;
  Color local_68;
  Color local_58;
  Color local_48;
  Color local_38;
  Color local_28;
  Color local_18;
  
  glPushAttrib(0x2000);
  glDisable(0xb50);
  glBlendFunc(1,0);
  glLineWidth(0x3a83126f);
  glEnable(0xb71);
  Color::Color(&local_18,0.5,0.5,0.5,0.25);
  Color::Color(&local_28,1.0,0.25,0.0,0.6);
  Color::Color(&local_38,1.0,1.0,1.0,0.6);
  Color::Color(&local_48,0.6,0.6,1.0,1.0);
  Color::Color(&local_58,0.8,0.8,1.0,1.0);
  Color::Color(&local_68,0.0,0.0,0.0,0.5);
  ppBVar5 = std::
            stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
            ::top((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                   *)0x25578c);
  local_70 = *ppBVar5;
  glPolygonOffset(0x3f800000);
  glEnable(0x8037);
  bVar4 = StaticScene::BVHNode::isLeaf(local_70);
  if (bVar4) {
    for (local_78 = 0; local_78 < local_70->range; local_78 = local_78 + 1) {
      ppPVar6 = std::
                vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                ::operator[]((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                              *)(*(long *)(in_RDI + 0x70) + 8),local_70->start + local_78);
      (*(*ppPVar6)->_vptr_Primitive[4])(*ppPVar6,&local_48);
    }
  }
  else {
    if (local_70->l != (BVHNode *)0x0) {
      local_80 = local_70->l;
      for (local_88 = 0; local_88 < local_80->range; local_88 = local_88 + 1) {
        ppPVar6 = std::
                  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                  ::operator[]((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                                *)(*(long *)(in_RDI + 0x70) + 8),local_80->start + local_88);
        (*(*ppPVar6)->_vptr_Primitive[4])(*ppPVar6,&local_48);
      }
    }
    if (local_70->r != (BVHNode *)0x0) {
      local_90 = local_70->r;
      for (local_98 = 0; local_98 < local_90->range; local_98 = local_98 + 1) {
        ppPVar6 = std::
                  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                  ::operator[]((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                                *)(*(long *)(in_RDI + 0x70) + 8),local_90->start + local_98);
        (*(*ppPVar6)->_vptr_Primitive[4])(*ppPVar6,&local_58);
      }
    }
  }
  glDisable(0x8037);
  for (local_a0 = 0; local_a0 < local_70->range; local_a0 = local_a0 + 1) {
    ppPVar6 = std::
              vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
              ::operator[]((vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
                            *)(*(long *)(in_RDI + 0x70) + 8),local_70->start + local_a0);
    (*(*ppPVar6)->_vptr_Primitive[5])(*ppPVar6,&local_68);
  }
  glDepthMask(0);
  std::
  stack<CMU462::StaticScene::BVHNode*,std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>>
  ::
  stack<std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>,void>
            ((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              *)in_stack_fffffffffffffdd0);
  local_f8 = StaticScene::BVHAccel::get_root(*(BVHAccel **)(in_RDI + 0x70));
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
          *)in_stack_fffffffffffffdd0,
         (value_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  while (bVar4 = std::
                 stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                 ::empty((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                          *)0x255a4e), ((bVar4 ^ 0xffU) & 1) != 0) {
    ppBVar7 = std::
              stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              ::top((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
                     *)0x255a70);
    local_110 = *ppBVar7;
    std::
    stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
    ::pop((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
           *)0x255a94);
    local_128.r = local_18.r;
    local_128.g = local_18.g;
    local_128.b = local_18.b;
    local_128.a = local_18.a;
    c.g = in_stack_fffffffffffffddc;
    c.r = (float)in_stack_fffffffffffffdd8;
    c.b = (float)(int)in_stack_fffffffffffffde0;
    c.a = (float)(int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    BBox::draw(in_stack_fffffffffffffdd0,c);
    if (local_110->l != (BVHNode *)0x0) {
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              *)in_stack_fffffffffffffdd0,
             (value_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
    if (local_110->r != (BVHNode *)0x0) {
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::push((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
              *)in_stack_fffffffffffffdd0,
             (value_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
  }
  if (local_70->l != (BVHNode *)0x0) {
    local_138.r = local_38.r;
    local_138.g = local_38.g;
    local_138.b = local_38.b;
    local_138.a = local_38.a;
    c_00.g = in_stack_fffffffffffffddc;
    c_00.r = (float)in_stack_fffffffffffffdd8;
    c_00.b = (float)(int)in_stack_fffffffffffffde0;
    c_00.a = (float)(int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    BBox::draw(in_stack_fffffffffffffdd0,c_00);
  }
  if (local_70->r != (BVHNode *)0x0) {
    local_148.r = local_38.r;
    local_148.g = local_38.g;
    local_148.b = local_38.b;
    local_148.a = local_38.a;
    c_01.g = in_stack_fffffffffffffddc;
    c_01.r = (float)in_stack_fffffffffffffdd8;
    c_01.b = (float)(int)in_stack_fffffffffffffde0;
    c_01.a = (float)(int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
    BBox::draw(in_stack_fffffffffffffdd0,c_01);
  }
  glLineWidth(0x40400000);
  local_158.r = local_28.r;
  local_158.g = local_28.g;
  local_158.b = local_28.b;
  local_158.a = local_28.a;
  c_02.g = in_stack_fffffffffffffddc;
  c_02.r = (float)in_stack_fffffffffffffdd8;
  c_02.b = (float)(int)in_stack_fffffffffffffde0;
  c_02.a = (float)(int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  BBox::draw(in_stack_fffffffffffffdd0,c_02);
  if ((*(byte *)(in_RDI + 0x1e0) & 1) != 0) {
    glLineWidth(0x3f800000);
    glBegin(1);
    for (local_160 = 0; uVar3 = local_160,
        sVar8 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::size
                          ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                           (in_RDI + 0x1c8)), uVar3 < sVar8; local_160 = local_160 + 500) {
      local_168 = 100000.0;
      if (((*(byte *)(in_RDI + 0x1e1) & 1) != 0) ||
         (pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                             ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                              (in_RDI + 0x1c8),local_160),
         0.0 < pvVar9->hit_t || pvVar9->hit_t == 0.0)) {
        pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                           ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                            (in_RDI + 0x1c8),local_160);
        if (pvVar9->hit_t < 0.0) {
          glColor4f(0x3f800000,0,0,0x3dcccccd);
        }
        else {
          pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                             ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                              (in_RDI + 0x1c8),local_160);
          local_168 = pvVar9->hit_t;
          glColor4f(0x3f800000,0x3f800000,0,0x3dcccccd);
        }
        std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                  ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)(in_RDI + 0x1c8)
                   ,local_160);
        std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                  ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)(in_RDI + 0x1c8)
                   ,local_160);
        CMU462::operator*((double *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                          &in_stack_fffffffffffffdd0->max);
        Vector3D::operator+((Vector3D *)
                            CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                            &in_stack_fffffffffffffdd0->max);
        pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                           ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                            (in_RDI + 0x1c8),local_160);
        local_1b0[5] = 0;
        pdVar10 = Vector3D::operator[](&pvVar9->o,local_1b0 + 5);
        dVar1 = *pdVar10;
        pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                           ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                            (in_RDI + 0x1c8),local_160);
        local_1b0[4] = 1;
        pdVar10 = Vector3D::operator[](&pvVar9->o,local_1b0 + 4);
        dVar2 = *pdVar10;
        pvVar9 = std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::operator[]
                           ((vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)
                            (in_RDI + 0x1c8),local_160);
        local_1b0[3] = 2;
        pdVar10 = Vector3D::operator[](&pvVar9->o,local_1b0 + 3);
        glVertex3f((float)dVar1,(float)dVar2,
                   CONCAT44((int)((ulong)*pdVar10 >> 0x20),(float)*pdVar10));
        local_1b0[2] = 0;
        pdVar10 = Vector3D::operator[](&local_180,local_1b0 + 2);
        in_stack_fffffffffffffddc = (float)*pdVar10;
        local_1b0[1] = 1;
        Vector3D::operator[](&local_180,local_1b0 + 1);
        local_1b0[0] = 2;
        in_stack_fffffffffffffdd0 = (BBox *)Vector3D::operator[](&local_180,local_1b0);
        glVertex3f(in_stack_fffffffffffffddc);
      }
    }
    glEnd();
  }
  glDepthMask(1);
  glPopAttrib();
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::~stack((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
            *)0x255fd6);
  return;
}

Assistant:

void PathTracer::visualize_accel() const {
  glPushAttrib(GL_ENABLE_BIT);
  glDisable(GL_LIGHTING);
  glBlendFunc(GL_ONE, GL_ZERO);
  glLineWidth(.001);
  glEnable(GL_DEPTH_TEST);

  // hardcoded color settings
  Color cnode = Color(.5, .5, .5, .25);
  Color cnode_hl = Color(1., .25, .0, .6);
  Color cnode_hl_child = Color(1., 1., 1., .6);

  Color cprim_hl_left = Color(.6, .6, 1., 1);
  Color cprim_hl_right = Color(.8, .8, 1., 1);
  Color cprim_hl_edges = Color(0., 0., 0., 0.5);

  BVHNode *selected = selectionHistory.top();

  // render solid geometry (with depth offset)
  glPolygonOffset(1.0, 1.0);
  glEnable(GL_POLYGON_OFFSET_FILL);

  if (selected->isLeaf()) {
    for (size_t i = 0; i < selected->range; ++i) {
      bvh->primitives[selected->start + i]->draw(cprim_hl_left);
    }
  } else {
    if (selected->l) {
      BVHNode *child = selected->l;
      for (size_t i = 0; i < child->range; ++i) {
        bvh->primitives[child->start + i]->draw(cprim_hl_left);
      }
    }
    if (selected->r) {
      BVHNode *child = selected->r;
      for (size_t i = 0; i < child->range; ++i) {
        bvh->primitives[child->start + i]->draw(cprim_hl_right);
      }
    }
  }

  glDisable(GL_POLYGON_OFFSET_FILL);

  // draw geometry outline
  for (size_t i = 0; i < selected->range; ++i) {
    bvh->primitives[selected->start + i]->drawOutline(cprim_hl_edges);
  }

  // keep depth buffer check enabled so that mesh occluded bboxes, but
  // disable depth write so that bboxes don't occlude each other.
  glDepthMask(GL_FALSE);

  // create traversal stack
  stack<BVHNode *> tstack;

  // push initial traversal data
  tstack.push(bvh->get_root());

  // draw all BVH bboxes with non-highlighted color
  while (!tstack.empty()) {
    BVHNode *current = tstack.top();
    tstack.pop();

    current->bb.draw(cnode);
    if (current->l) tstack.push(current->l);
    if (current->r) tstack.push(current->r);
  }

  // draw selected node bbox and primitives
  if (selected->l) selected->l->bb.draw(cnode_hl_child);
  if (selected->r) selected->r->bb.draw(cnode_hl_child);

  glLineWidth(3.f);
  selected->bb.draw(cnode_hl);

  // now perform visualization of the rays
  if (show_rays) {
    glLineWidth(1.f);
    glBegin(GL_LINES);

    for (size_t i = 0; i < rayLog.size(); i += 500) {
      const static double VERY_LONG = 10e4;
      double ray_t = VERY_LONG;

	  if (!show_hitting_rays && rayLog[i].hit_t < 0.0) continue;

      // color rays that are hits yellow
      // and rays this miss all geometry red
      if (rayLog[i].hit_t >= 0.0) {
        ray_t = rayLog[i].hit_t;
        glColor4f(1.f, 1.f, 0.f, 0.1f);
      } else {
        glColor4f(1.f, 0.f, 0.f, 0.1f);
      }

      Vector3D end = rayLog[i].o + ray_t * rayLog[i].d;

      glVertex3f(rayLog[i].o[0], rayLog[i].o[1], rayLog[i].o[2]);
      glVertex3f(end[0], end[1], end[2]);
    }
    glEnd();
  }

  glDepthMask(GL_TRUE);
  glPopAttrib();
}